

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

void roaring64_bitmap_free(roaring64_bitmap_t *r)

{
  art_val_t *__ptr;
  leaf_t *leaf;
  art_iterator_t it;
  
  art_init_iterator(&it,&r->art,true);
  while (__ptr = it.value, it.value != (art_val_t *)0x0) {
    container_free(*(container_t **)(it.value[1].key + 2),it.value[1].key[0]);
    roaring_free(__ptr);
    art_iterator_next(&it);
  }
  art_free(&r->art);
  roaring_free(r);
  return;
}

Assistant:

void roaring64_bitmap_free(roaring64_bitmap_t *r) {
    art_iterator_t it = art_init_iterator(&r->art, /*first=*/true);
    while (it.value != NULL) {
        leaf_t *leaf = (leaf_t *)it.value;
        container_free(leaf->container, leaf->typecode);
        free_leaf(leaf);
        art_iterator_next(&it);
    }
    art_free(&r->art);
    roaring_free(r);
}